

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.cc
# Opt level: O2

void benchmark::ToExponentAndMantissa
               (double val,double thresh,int precision,double one_k,string *mantissa,
               int64_t *exponent)

{
  long lVar1;
  double dVar2;
  double dVar3;
  double local_1e8;
  string local_1c8 [32];
  stringstream mantissa_stream;
  ostream local_198 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&mantissa_stream);
  local_1e8 = val;
  if (val < 0.0) {
    std::operator<<(local_198,"-");
    local_1e8 = -val;
  }
  dVar2 = pow(10.0,(double)precision);
  dVar3 = 1.0 / dVar2;
  if (1.0 / dVar2 <= thresh) {
    dVar3 = thresh;
  }
  if (local_1e8 <= dVar3 * one_k) {
    if (dVar3 <= local_1e8) {
      std::ostream::_M_insert<double>(local_1e8);
    }
    else {
      dVar2 = local_1e8;
      for (lVar1 = -1; lVar1 != -10; lVar1 = lVar1 + -1) {
        dVar2 = dVar2 * one_k;
        if (dVar3 <= dVar2) {
          std::ostream::_M_insert<double>(dVar2);
          *exponent = lVar1;
          std::__cxx11::stringbuf::str();
          goto LAB_0010d2d1;
        }
      }
      std::ostream::_M_insert<double>(local_1e8);
    }
  }
  else {
    dVar2 = local_1e8;
    for (lVar1 = 1; lVar1 != 10; lVar1 = lVar1 + 1) {
      dVar2 = dVar2 / one_k;
      if (dVar2 <= dVar3 * one_k) {
        std::ostream::_M_insert<double>(dVar2);
        *exponent = lVar1;
        std::__cxx11::stringbuf::str();
        goto LAB_0010d2d1;
      }
    }
    std::ostream::_M_insert<double>(local_1e8);
  }
  *exponent = 0;
  std::__cxx11::stringbuf::str();
LAB_0010d2d1:
  std::__cxx11::string::operator=((string *)mantissa,local_1c8);
  std::__cxx11::string::~string(local_1c8);
  std::__cxx11::stringstream::~stringstream((stringstream *)&mantissa_stream);
  return;
}

Assistant:

void ToExponentAndMantissa(double val, double thresh, int precision,
                           double one_k, std::string* mantissa,
                           int64_t* exponent) {
  std::stringstream mantissa_stream;

  if (val < 0) {
    mantissa_stream << "-";
    val = -val;
  }

  // Adjust threshold so that it never excludes things which can't be rendered
  // in 'precision' digits.
  const double adjusted_threshold =
      std::max(thresh, 1.0 / std::pow(10.0, precision));
  const double big_threshold = adjusted_threshold * one_k;
  const double small_threshold = adjusted_threshold;

  if (val > big_threshold) {
    // Positive powers
    double scaled = val;
    for (size_t i = 0; i < arraysize(kBigSIUnits); ++i) {
      scaled /= one_k;
      if (scaled <= big_threshold) {
        mantissa_stream << scaled;
        *exponent = i + 1;
        *mantissa = mantissa_stream.str();
        return;
      }
    }
    mantissa_stream << val;
    *exponent = 0;
  } else if (val < small_threshold) {
    // Negative powers
    double scaled = val;
    for (size_t i = 0; i < arraysize(kSmallSIUnits); ++i) {
      scaled *= one_k;
      if (scaled >= small_threshold) {
        mantissa_stream << scaled;
        *exponent = -static_cast<int64_t>(i + 1);
        *mantissa = mantissa_stream.str();
        return;
      }
    }
    mantissa_stream << val;
    *exponent = 0;
  } else {
    mantissa_stream << val;
    *exponent = 0;
  }
  *mantissa = mantissa_stream.str();
}